

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Function_Type.cxx
# Opt level: O1

Fl_Type * __thiscall Fl_Class_Type::make(Fl_Class_Type *this)

{
  int iVar1;
  Fl_Type *this_00;
  Fl_Type *p;
  
  for (p = Fl_Type::current; p != (Fl_Type *)0x0; p = p->parent) {
    iVar1 = (*p->_vptr_Fl_Type[0x24])(p);
    if (iVar1 != 0) break;
  }
  this_00 = (Fl_Type *)operator_new(0x98);
  Fl_Type::Fl_Type(this_00);
  this_00->_vptr_Fl_Type = (_func_int **)&PTR_setlabel_00270f10;
  this_00[1]._vptr_Fl_Type = (_func_int **)0x0;
  Fl_Type::name(this_00,"UserInterface");
  this_00[1].callback_ = (char *)0x0;
  this_00[1]._vptr_Fl_Type = (_func_int **)0x0;
  *(undefined1 *)&this_00[1].name_ = 1;
  Fl_Type::add(this_00,p);
  this_00->factory = &this->super_Fl_Type;
  return this_00;
}

Assistant:

Fl_Type *Fl_Class_Type::make() {
  Fl_Type *p = Fl_Type::current;
  while (p && !p->is_decl_block()) p = p->parent;
  Fl_Class_Type *o = new Fl_Class_Type();
  o->name("UserInterface");
  o->class_prefix=0;
  o->subclass_of = 0;
  o->public_ = 1;
  o->add(p);
  o->factory = this;
  return o;
}